

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeHostSystemInformationCommand.cxx
# Opt level: O2

bool cmCMakeHostSystemInformationCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  char cVar1;
  pointer pcVar2;
  cmMakefile *pcVar3;
  string_view separator;
  size_type sVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  _anonymous_namespace_ *p_Var9;
  _Rb_tree_node_base *p_Var10;
  const_iterator cVar11;
  size_t sVar12;
  string *psVar13;
  istream *piVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  optional<cmWindowsRegistry::View> oVar15;
  ulong uVar16;
  char *value_00;
  char *value_01;
  char *value_02;
  char *value_03;
  char *value_04;
  char *value_05;
  char *value_06;
  char *extraout_RDX;
  char *extraout_RDX_00;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __i;
  long lVar17;
  size_type sVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar19;
  pointer pbVar20;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it;
  string *psVar21;
  Arguments *this;
  pointer pbVar22;
  pointer pbVar23;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  _Storage<cmWindowsRegistry::View,_true> view;
  long lVar24;
  _Alloc_hider _Var25;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_05;
  string_view str;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_07;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_08;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_09;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_10;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_11;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_12;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_13;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_14;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_15;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_16;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_17;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_18;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_19;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_20;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_21;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_22;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_23;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_24;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_25;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_26;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_27;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_28;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_29;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_30;
  string_view str_00;
  string_view sVar26;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  static_string_view name_02;
  static_string_view name_03;
  static_string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  string_view separator_00;
  basic_string_view<char,_std::char_traits<char>_> __y_02;
  basic_string_view<char,_std::char_traits<char>_> __y_03;
  basic_string_view<char,_std::char_traits<char>_> __y_04;
  string_view prefix;
  basic_string_view<char,_std::char_traits<char>_> __y_05;
  string_view value_07;
  basic_string_view<char,_std::char_traits<char>_> __y_06;
  basic_string_view<char,_std::char_traits<char>_> __y_07;
  basic_string_view<char,_std::char_traits<char>_> __y_08;
  basic_string_view<char,_std::char_traits<char>_> __y_09;
  basic_string_view<char,_std::char_traits<char>_> __y_10;
  basic_string_view<char,_std::char_traits<char>_> __y_11;
  basic_string_view<char,_std::char_traits<char>_> __y_12;
  basic_string_view<char,_std::char_traits<char>_> __y_13;
  basic_string_view<char,_std::char_traits<char>_> __y_14;
  basic_string_view<char,_std::char_traits<char>_> __y_15;
  basic_string_view<char,_std::char_traits<char>_> __y_16;
  basic_string_view<char,_std::char_traits<char>_> __y_17;
  basic_string_view<char,_std::char_traits<char>_> __y_18;
  basic_string_view<char,_std::char_traits<char>_> __y_19;
  basic_string_view<char,_std::char_traits<char>_> __y_20;
  basic_string_view<char,_std::char_traits<char>_> __y_21;
  basic_string_view<char,_std::char_traits<char>_> __y_22;
  basic_string_view<char,_std::char_traits<char>_> __y_23;
  basic_string_view<char,_std::char_traits<char>_> __y_24;
  basic_string_view<char,_std::char_traits<char>_> __y_25;
  basic_string_view<char,_std::char_traits<char>_> __y_26;
  basic_string_view<char,_std::char_traits<char>_> __y_27;
  basic_string_view<char,_std::char_traits<char>_> __y_28;
  basic_string_view<char,_std::char_traits<char>_> __y_29;
  string_view prefix_00;
  string_view key;
  string_view separator_01;
  string_view value_08;
  string_view key_00;
  string_view separator_02;
  string_view value_09;
  string_view key_01;
  const_iterator local_478;
  string vars;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  scripts;
  cmWindowsRegistry registry;
  bool local_3f0;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  invalidArgs;
  string line;
  cmArgumentParser<Arguments> parser;
  optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  result;
  _Any_data local_2c0;
  _Manager_type local_2b0;
  _Invoker_type p_Stack_2a8;
  bool local_2a0;
  undefined1 local_298 [32];
  ulong local_278;
  string *local_270;
  string *local_268;
  pointer local_260;
  string result_list;
  Arguments arguments;
  
  pbVar23 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (((ulong)((long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar23) < 0x21) ||
     (__x_00._M_str = (pbVar23->_M_dataplus)._M_p, __x_00._M_len = pbVar23->_M_string_length,
     __y._M_str = "RESULT", __y._M_len = 6, bVar5 = std::operator!=(__x_00,__y), bVar5)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&arguments,"missing RESULT specification.",(allocator<char> *)&parser);
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00260451:
    std::__cxx11::string::~string((string *)&arguments);
    return false;
  }
  pbVar23 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (((ulong)((long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar23) < 0x80) ||
     (__x_01._M_str = pbVar23[2]._M_dataplus._M_p, __x_01._M_len = pbVar23[2]._M_string_length,
     __y_00._M_str = "QUERY", __y_00._M_len = 5, bVar5 = std::operator!=(__x_01,__y_00), bVar5)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&arguments,"missing QUERY specification",(allocator<char> *)&parser);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    goto LAB_00260451;
  }
  psVar21 = pbVar23 + 1;
  pbVar22 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  __x_02._M_str = pbVar22[3]._M_dataplus._M_p;
  __x_02._M_len = pbVar22[3]._M_string_length;
  __y_01._M_str = "WINDOWS_REGISTRY";
  __y_01._M_len = 0x10;
  bVar5 = std::operator==(__x_02,__y_01);
  if (!bVar5) {
    local_260 = pbVar23;
    if ((cmCMakeHostSystemInformationCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
         ::info == '\0') &&
       (iVar8 = __cxa_guard_acquire(&cmCMakeHostSystemInformationCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                     ::info), iVar8 != 0)) {
      cmsys::SystemInformation::SystemInformation(&cmCMakeHostSystemInformationCommand::info);
      __cxa_atexit(cmsys::SystemInformation::~SystemInformation,
                   &cmCMakeHostSystemInformationCommand::info,&__dso_handle);
      __cxa_guard_release(&cmCMakeHostSystemInformationCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                           ::info);
    }
    if (cmCMakeHostSystemInformationCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
        ::initialized == '\0') {
      cmsys::SystemInformation::RunCPUCheck(&cmCMakeHostSystemInformationCommand::info);
      cmsys::SystemInformation::RunOSCheck(&cmCMakeHostSystemInformationCommand::info);
      cmsys::SystemInformation::RunMemoryCheck(&cmCMakeHostSystemInformationCommand::info);
      cmCMakeHostSystemInformationCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
      ::initialized = '\x01';
    }
    result_list._M_dataplus._M_p = (pointer)&result_list.field_2;
    result_list._M_string_length = 0;
    result_list.field_2._M_local_buf[0] = '\0';
    local_268 = (string *)&status->Error;
    uVar16 = 3;
    do {
      bVar5 = (ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar16;
      if (bVar5) {
        sVar26._M_str = result_list._M_dataplus._M_p;
        sVar26._M_len = result_list._M_string_length;
        cmMakefile::AddDefinition(status->Makefile,psVar21,sVar26);
        break;
      }
      local_278 = uVar16;
      std::__cxx11::string::append((string *)&result_list);
      pbVar23 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      __rhs = pbVar23 + local_278;
      __x_03._M_str = pbVar23[local_278]._M_dataplus._M_p;
      __x_03._M_len = pbVar23[local_278]._M_string_length;
      __y_02._M_str = "NUMBER_OF_LOGICAL_CORES";
      __y_02._M_len = 0x17;
      bVar6 = std::operator==(__x_03,__y_02);
      if (bVar6) {
        uVar7 = cmsys::SystemInformation::GetNumberOfLogicalCPU
                          (&cmCMakeHostSystemInformationCommand::info);
        std::__cxx11::to_string((string *)&arguments,(ulong)uVar7);
LAB_00260942:
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&registry,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arguments);
        this = &arguments;
LAB_00260950:
        std::__cxx11::string::~string((string *)this);
      }
      else {
        __x_04._M_str = (__rhs->_M_dataplus)._M_p;
        __x_04._M_len = __rhs->_M_string_length;
        __y_03._M_str = "NUMBER_OF_PHYSICAL_CORES";
        __y_03._M_len = 0x18;
        bVar6 = std::operator==(__x_04,__y_03);
        if (bVar6) {
          uVar7 = cmsys::SystemInformation::GetNumberOfPhysicalCPU
                            (&cmCMakeHostSystemInformationCommand::info);
          std::__cxx11::to_string((string *)&arguments,(ulong)uVar7);
          goto LAB_00260942;
        }
        __x_05._M_str = (__rhs->_M_dataplus)._M_p;
        __x_05._M_len = __rhs->_M_string_length;
        __y_04._M_str = "HOSTNAME";
        __y_04._M_len = 8;
        bVar6 = std::operator==(__x_05,__y_04);
        if (bVar6) {
          p_Var9 = (_anonymous_namespace_ *)
                   cmsys::SystemInformation::GetHostname(&cmCMakeHostSystemInformationCommand::info)
          ;
          (anonymous_namespace)::ValueToString_abi_cxx11_((string *)&arguments,p_Var9,value_00);
          goto LAB_00260942;
        }
        __x_07._M_str = (__rhs->_M_dataplus)._M_p;
        __x_07._M_len = __rhs->_M_string_length;
        __y_06._M_str = "FQDN";
        __y_06._M_len = 4;
        bVar6 = std::operator==(__x_07,__y_06);
        if (bVar6) {
          cmsys::SystemInformation::GetFullyQualifiedDomainName_abi_cxx11_
                    ((string *)&parser,&cmCMakeHostSystemInformationCommand::info);
          this = (Arguments *)&parser;
          std::__cxx11::string::string((string *)&arguments,(string *)this);
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&registry,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arguments
                    );
          std::__cxx11::string::~string((string *)&arguments);
          goto LAB_00260950;
        }
        __x_08._M_str = (__rhs->_M_dataplus)._M_p;
        __x_08._M_len = __rhs->_M_string_length;
        __y_07._M_str = "TOTAL_VIRTUAL_MEMORY";
        __y_07._M_len = 0x14;
        bVar6 = std::operator==(__x_08,__y_07);
        if (bVar6) {
          sVar12 = cmsys::SystemInformation::GetTotalVirtualMemory
                             (&cmCMakeHostSystemInformationCommand::info);
          std::__cxx11::to_string((string *)&arguments,sVar12);
          goto LAB_00260942;
        }
        __x_09._M_str = (__rhs->_M_dataplus)._M_p;
        __x_09._M_len = __rhs->_M_string_length;
        __y_08._M_str = "AVAILABLE_VIRTUAL_MEMORY";
        __y_08._M_len = 0x18;
        bVar6 = std::operator==(__x_09,__y_08);
        if (bVar6) {
          sVar12 = cmsys::SystemInformation::GetAvailableVirtualMemory
                             (&cmCMakeHostSystemInformationCommand::info);
          std::__cxx11::to_string((string *)&arguments,sVar12);
          goto LAB_00260942;
        }
        __x_10._M_str = (__rhs->_M_dataplus)._M_p;
        __x_10._M_len = __rhs->_M_string_length;
        __y_09._M_str = "TOTAL_PHYSICAL_MEMORY";
        __y_09._M_len = 0x15;
        bVar6 = std::operator==(__x_10,__y_09);
        if (bVar6) {
          sVar12 = cmsys::SystemInformation::GetTotalPhysicalMemory
                             (&cmCMakeHostSystemInformationCommand::info);
          std::__cxx11::to_string((string *)&arguments,sVar12);
          goto LAB_00260942;
        }
        __x_11._M_str = (__rhs->_M_dataplus)._M_p;
        __x_11._M_len = __rhs->_M_string_length;
        __y_10._M_str = "AVAILABLE_PHYSICAL_MEMORY";
        __y_10._M_len = 0x19;
        bVar6 = std::operator==(__x_11,__y_10);
        if (bVar6) {
          sVar12 = cmsys::SystemInformation::GetAvailablePhysicalMemory
                             (&cmCMakeHostSystemInformationCommand::info);
          std::__cxx11::to_string((string *)&arguments,sVar12);
          goto LAB_00260942;
        }
        __x_12._M_str = (__rhs->_M_dataplus)._M_p;
        __x_12._M_len = __rhs->_M_string_length;
        __y_11._M_str = "IS_64BIT";
        __y_11._M_len = 8;
        bVar6 = std::operator==(__x_12,__y_11);
        if (bVar6) {
          bVar6 = cmsys::SystemInformation::Is64Bits(&cmCMakeHostSystemInformationCommand::info);
          std::__cxx11::to_string((string *)&arguments,(ulong)bVar6);
          goto LAB_00260942;
        }
        __x_13._M_str = (__rhs->_M_dataplus)._M_p;
        __x_13._M_len = __rhs->_M_string_length;
        __y_12._M_str = "HAS_FPU";
        __y_12._M_len = 7;
        bVar6 = std::operator==(__x_13,__y_12);
        if (bVar6) {
          bVar6 = cmsys::SystemInformation::DoesCPUSupportFeature
                            (&cmCMakeHostSystemInformationCommand::info,0x800000);
          std::__cxx11::to_string((string *)&arguments,(ulong)bVar6);
          goto LAB_00260942;
        }
        __x_14._M_str = (__rhs->_M_dataplus)._M_p;
        __x_14._M_len = __rhs->_M_string_length;
        __y_13._M_str = "HAS_MMX";
        __y_13._M_len = 7;
        bVar6 = std::operator==(__x_14,__y_13);
        if (bVar6) {
          bVar6 = cmsys::SystemInformation::DoesCPUSupportFeature
                            (&cmCMakeHostSystemInformationCommand::info,1);
          std::__cxx11::to_string((string *)&arguments,(ulong)bVar6);
          goto LAB_00260942;
        }
        __x_15._M_str = (__rhs->_M_dataplus)._M_p;
        __x_15._M_len = __rhs->_M_string_length;
        __y_14._M_str = "HAS_MMX_PLUS";
        __y_14._M_len = 0xc;
        bVar6 = std::operator==(__x_15,__y_14);
        if (bVar6) {
          bVar6 = cmsys::SystemInformation::DoesCPUSupportFeature
                            (&cmCMakeHostSystemInformationCommand::info,2);
          std::__cxx11::to_string((string *)&arguments,(ulong)bVar6);
          goto LAB_00260942;
        }
        __x_16._M_str = (__rhs->_M_dataplus)._M_p;
        __x_16._M_len = __rhs->_M_string_length;
        __y_15._M_str = "HAS_SSE";
        __y_15._M_len = 7;
        bVar6 = std::operator==(__x_16,__y_15);
        if (bVar6) {
          bVar6 = cmsys::SystemInformation::DoesCPUSupportFeature
                            (&cmCMakeHostSystemInformationCommand::info,4);
          std::__cxx11::to_string((string *)&arguments,(ulong)bVar6);
          goto LAB_00260942;
        }
        __x_17._M_str = (__rhs->_M_dataplus)._M_p;
        __x_17._M_len = __rhs->_M_string_length;
        __y_16._M_str = "HAS_SSE2";
        __y_16._M_len = 8;
        bVar6 = std::operator==(__x_17,__y_16);
        if (bVar6) {
          bVar6 = cmsys::SystemInformation::DoesCPUSupportFeature
                            (&cmCMakeHostSystemInformationCommand::info,8);
          std::__cxx11::to_string((string *)&arguments,(ulong)bVar6);
          goto LAB_00260942;
        }
        __x_18._M_str = (__rhs->_M_dataplus)._M_p;
        __x_18._M_len = __rhs->_M_string_length;
        __y_17._M_str = "HAS_SSE_FP";
        __y_17._M_len = 10;
        bVar6 = std::operator==(__x_18,__y_17);
        if (bVar6) {
          bVar6 = cmsys::SystemInformation::DoesCPUSupportFeature
                            (&cmCMakeHostSystemInformationCommand::info,0x800);
          std::__cxx11::to_string((string *)&arguments,(ulong)bVar6);
          goto LAB_00260942;
        }
        __x_19._M_str = (__rhs->_M_dataplus)._M_p;
        __x_19._M_len = __rhs->_M_string_length;
        __y_18._M_str = "HAS_SSE_MMX";
        __y_18._M_len = 0xb;
        bVar6 = std::operator==(__x_19,__y_18);
        if (bVar6) {
          bVar6 = cmsys::SystemInformation::DoesCPUSupportFeature
                            (&cmCMakeHostSystemInformationCommand::info,0x1000);
          std::__cxx11::to_string((string *)&arguments,(ulong)bVar6);
          goto LAB_00260942;
        }
        __x_20._M_str = (__rhs->_M_dataplus)._M_p;
        __x_20._M_len = __rhs->_M_string_length;
        __y_19._M_str = "HAS_AMD_3DNOW";
        __y_19._M_len = 0xd;
        bVar6 = std::operator==(__x_20,__y_19);
        if (bVar6) {
          bVar6 = cmsys::SystemInformation::DoesCPUSupportFeature
                            (&cmCMakeHostSystemInformationCommand::info,0x10);
          std::__cxx11::to_string((string *)&arguments,(ulong)bVar6);
          goto LAB_00260942;
        }
        __x_21._M_str = (__rhs->_M_dataplus)._M_p;
        __x_21._M_len = __rhs->_M_string_length;
        __y_20._M_str = "HAS_AMD_3DNOW_PLUS";
        __y_20._M_len = 0x12;
        bVar6 = std::operator==(__x_21,__y_20);
        if (bVar6) {
          bVar6 = cmsys::SystemInformation::DoesCPUSupportFeature
                            (&cmCMakeHostSystemInformationCommand::info,0x20);
          std::__cxx11::to_string((string *)&arguments,(ulong)bVar6);
          goto LAB_00260942;
        }
        __x_22._M_str = (__rhs->_M_dataplus)._M_p;
        __x_22._M_len = __rhs->_M_string_length;
        __y_21._M_str = "HAS_IA64";
        __y_21._M_len = 8;
        bVar6 = std::operator==(__x_22,__y_21);
        if (bVar6) {
          bVar6 = cmsys::SystemInformation::DoesCPUSupportFeature
                            (&cmCMakeHostSystemInformationCommand::info,0x40);
          std::__cxx11::to_string((string *)&arguments,(ulong)bVar6);
          goto LAB_00260942;
        }
        __x_23._M_str = (__rhs->_M_dataplus)._M_p;
        __x_23._M_len = __rhs->_M_string_length;
        __y_22._M_str = "HAS_SERIAL_NUMBER";
        __y_22._M_len = 0x11;
        bVar6 = std::operator==(__x_23,__y_22);
        if (bVar6) {
          bVar6 = cmsys::SystemInformation::DoesCPUSupportFeature
                            (&cmCMakeHostSystemInformationCommand::info,0x200);
          std::__cxx11::to_string((string *)&arguments,(ulong)bVar6);
          goto LAB_00260942;
        }
        __x_24._M_str = (__rhs->_M_dataplus)._M_p;
        __x_24._M_len = __rhs->_M_string_length;
        __y_23._M_str = "PROCESSOR_NAME";
        __y_23._M_len = 0xe;
        bVar6 = std::operator==(__x_24,__y_23);
        if (bVar6) {
          p_Var9 = (_anonymous_namespace_ *)
                   cmsys::SystemInformation::GetExtendedProcessorName
                             (&cmCMakeHostSystemInformationCommand::info);
          (anonymous_namespace)::ValueToString_abi_cxx11_((string *)&arguments,p_Var9,value_01);
          goto LAB_00260942;
        }
        __x_25._M_str = (__rhs->_M_dataplus)._M_p;
        __x_25._M_len = __rhs->_M_string_length;
        __y_24._M_str = "PROCESSOR_DESCRIPTION";
        __y_24._M_len = 0x15;
        bVar6 = std::operator==(__x_25,__y_24);
        if (bVar6) {
          cmsys::SystemInformation::GetCPUDescription_abi_cxx11_
                    ((string *)&arguments,&cmCMakeHostSystemInformationCommand::info);
          goto LAB_00260942;
        }
        __x_26._M_str = (__rhs->_M_dataplus)._M_p;
        __x_26._M_len = __rhs->_M_string_length;
        __y_25._M_str = "PROCESSOR_SERIAL_NUMBER";
        __y_25._M_len = 0x17;
        bVar6 = std::operator==(__x_26,__y_25);
        if (bVar6) {
          p_Var9 = (_anonymous_namespace_ *)
                   cmsys::SystemInformation::GetProcessorSerialNumber
                             (&cmCMakeHostSystemInformationCommand::info);
          (anonymous_namespace)::ValueToString_abi_cxx11_((string *)&arguments,p_Var9,value_02);
          goto LAB_00260942;
        }
        __x_27._M_str = (__rhs->_M_dataplus)._M_p;
        __x_27._M_len = __rhs->_M_string_length;
        __y_26._M_str = "OS_NAME";
        __y_26._M_len = 7;
        bVar6 = std::operator==(__x_27,__y_26);
        if (bVar6) {
          p_Var9 = (_anonymous_namespace_ *)
                   cmsys::SystemInformation::GetOSName(&cmCMakeHostSystemInformationCommand::info);
          (anonymous_namespace)::ValueToString_abi_cxx11_((string *)&arguments,p_Var9,value_03);
          goto LAB_00260942;
        }
        __x_28._M_str = (__rhs->_M_dataplus)._M_p;
        __x_28._M_len = __rhs->_M_string_length;
        __y_27._M_str = "OS_RELEASE";
        __y_27._M_len = 10;
        bVar6 = std::operator==(__x_28,__y_27);
        if (bVar6) {
          p_Var9 = (_anonymous_namespace_ *)
                   cmsys::SystemInformation::GetOSRelease
                             (&cmCMakeHostSystemInformationCommand::info);
          (anonymous_namespace)::ValueToString_abi_cxx11_((string *)&arguments,p_Var9,value_04);
          goto LAB_00260942;
        }
        __x_29._M_str = (__rhs->_M_dataplus)._M_p;
        __x_29._M_len = __rhs->_M_string_length;
        __y_28._M_str = "OS_VERSION";
        __y_28._M_len = 10;
        bVar6 = std::operator==(__x_29,__y_28);
        if (bVar6) {
          p_Var9 = (_anonymous_namespace_ *)
                   cmsys::SystemInformation::GetOSVersion
                             (&cmCMakeHostSystemInformationCommand::info);
          (anonymous_namespace)::ValueToString_abi_cxx11_((string *)&arguments,p_Var9,value_05);
          goto LAB_00260942;
        }
        __x_30._M_str = (__rhs->_M_dataplus)._M_p;
        __x_30._M_len = __rhs->_M_string_length;
        __y_29._M_str = "OS_PLATFORM";
        __y_29._M_len = 0xb;
        bVar6 = std::operator==(__x_30,__y_29);
        if (bVar6) {
          p_Var9 = (_anonymous_namespace_ *)
                   cmsys::SystemInformation::GetOSPlatform
                             (&cmCMakeHostSystemInformationCommand::info);
          (anonymous_namespace)::ValueToString_abi_cxx11_((string *)&arguments,p_Var9,value_06);
          goto LAB_00260942;
        }
        local_3f0 = false;
      }
      if (local_3f0 != true) {
        str._M_str = (__rhs->_M_dataplus)._M_p;
        str._M_len = __rhs->_M_string_length;
        prefix._M_str = "DISTRIB_";
        prefix._M_len = 8;
        bVar6 = cmHasPrefix(str,prefix);
        if (!bVar6) {
          arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
          _M_right = (_Base_ptr)
                     ((ulong)arguments.super_ParseResult.KeywordErrors._M_t._M_impl.
                             super__Rb_tree_header._M_header._M_right & 0xffffffffffffff00);
LAB_00260c65:
          value.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged = false;
LAB_00260c6d:
          std::
          _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&arguments);
          goto LAB_00260c75;
        }
        if (((anonymous_namespace)::
             GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)::
             s_os_release_abi_cxx11_ != '\0') ||
           (iVar8 = __cxa_guard_acquire(&(anonymous_namespace)::
                                         GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                                         ::s_os_release_abi_cxx11_), iVar8 == 0)) {
LAB_002609af:
          pcVar3 = status->Makefile;
          std::__cxx11::string::substr((ulong)&result,(ulong)__rhs);
          __x_06._M_str =
               (char *)result.
                       super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_payload._M_value.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          __x_06._M_len =
               (size_t)result.
                       super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_payload._M_value.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
          __y_05._M_str = "INFO";
          __y_05._M_len = 4;
          bVar6 = std::operator==(__x_06,__y_05);
          if (bVar6) {
            vars._M_dataplus._M_p = (pointer)&vars.field_2;
            vars._M_string_length = 0;
            vars.field_2._M_local_buf[0] = '\0';
            for (p_Var10 = (_Rb_tree_node_base *)
                           (anonymous_namespace)::
                           GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                           ::s_os_release_abi_cxx11_._24_8_;
                p_Var10 !=
                (_Rb_tree_node_base *)
                ((anonymous_namespace)::
                 GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                 ::s_os_release_abi_cxx11_ + 8);
                p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
              arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header
              ._0_8_ = local_260[1]._M_dataplus._M_p;
              arguments.super_ParseResult.KeywordErrors._M_t._M_impl._0_8_ =
                   local_260[1]._M_string_length;
              parser.super_Base.Bindings.Keywords.
              super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
              .
              super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
              parser.super_Base.Bindings.Keywords.
              super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
              .
              super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   (pointer)((long)&parser.super_Base.Bindings.Keywords.
                                    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                                    .
                                    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                                    ._M_impl + 0x10);
              parser.super_Base.Bindings.Keywords.
              super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
              .
              super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)CONCAT71(parser.super_Base.Bindings.Keywords.
                                     super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                                     .
                                     super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,0x5f);
              cmStrCat<std::__cxx11::string>
                        ((string *)&invalidArgs,(cmAlphaNum *)&arguments,(cmAlphaNum *)&parser,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var10 + 1));
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &arguments,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((anonymous_namespace)::DELIM_abi_cxx11_ +
                             (ulong)(vars._M_string_length != 0) * 0x20),(string *)&invalidArgs);
              std::__cxx11::string::append((string *)&vars);
              std::__cxx11::string::~string((string *)&arguments);
              value_07._M_str = *(char **)(p_Var10 + 2);
              value_07._M_len = (size_t)p_Var10[2]._M_parent;
              cmMakefile::AddDefinition(pcVar3,(string *)&invalidArgs,value_07);
              std::__cxx11::string::~string((string *)&invalidArgs);
            }
            std::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&arguments,&vars);
            std::__cxx11::string::~string((string *)&vars);
          }
          else {
            cVar11 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)(anonymous_namespace)::
                               GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                               ::s_os_release_abi_cxx11_,(key_type *)&result);
            if (cVar11._M_node ==
                (_Base_ptr)
                ((anonymous_namespace)::
                 GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                 ::s_os_release_abi_cxx11_ + 8)) {
              parser.super_Base.Bindings.Keywords.
              super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
              .
              super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)((long)&parser.super_Base.Bindings.Keywords.
                                    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                                    .
                                    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                                    ._M_impl + 0x10);
              parser.super_Base.Bindings.Keywords.
              super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
              .
              super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              parser.super_Base.Bindings.Keywords.
              super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
              .
              super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)((ulong)parser.super_Base.Bindings.Keywords.
                                    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                                    .
                                    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage &
                            0xffffffffffffff00);
              std::
              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::
              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&arguments,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &parser);
              std::__cxx11::string::~string((string *)&parser);
            }
            else {
              std::_Optional_payload_base<std::__cxx11::string>::
              _Optional_payload_base<std::__cxx11::string_const&>
                        ((_Optional_payload_base<std::__cxx11::string> *)&arguments,
                         cVar11._M_node + 2);
            }
          }
          std::__cxx11::string::~string((string *)&result);
          if (((ulong)arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header.
                      _M_header._M_right & 1) == 0) goto LAB_00260c65;
          std::
          _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ::_Optional_base(&value.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           ,(_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                             *)&arguments);
          goto LAB_00260c6d;
        }
        pcVar3 = status->Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&arguments,"CMAKE_SYSROOT",(allocator<char> *)&parser);
        psVar13 = cmMakefile::GetSafeDefinition(pcVar3,(string *)&arguments);
        std::__cxx11::string::~string((string *)&arguments);
        (anonymous_namespace)::
        GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)::
        s_os_release_abi_cxx11_._8_4_ = 0;
        (anonymous_namespace)::
        GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)::
        s_os_release_abi_cxx11_._16_8_ = 0;
        (anonymous_namespace)::
        GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)::
        s_os_release_abi_cxx11_._24_8_ = 0x7e5ef0;
        (anonymous_namespace)::
        GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)::
        s_os_release_abi_cxx11_._32_8_ = 0x7e5ef0;
        (anonymous_namespace)::
        GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)::
        s_os_release_abi_cxx11_._40_8_ = 0;
        local_298._0_8_ = (pointer)0xf;
        local_298._8_8_ = "/etc/os-release";
        local_298._16_8_ = 0x13;
        local_298._24_8_ = "/usr/lib/os-release";
        lVar17 = 0;
LAB_00261293:
        if (lVar17 != 0x20) {
          parser.super_Base.Bindings.Keywords.
          super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
          .
          super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(local_298 + lVar17);
          parser.super_Base.Bindings.Keywords.
          super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
          .
          super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(local_298 + lVar17 + 8);
          arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
          _0_8_ = (psVar13->_M_dataplus)._M_p;
          arguments.super_ParseResult.KeywordErrors._M_t._M_impl._0_8_ = psVar13->_M_string_length;
          cmStrCat<>((string *)&scripts,(cmAlphaNum *)&arguments,(cmAlphaNum *)&parser);
          bVar6 = cmsys::SystemTools::FileExists((string *)&scripts);
          if (!bVar6) goto code_r0x002612e8;
          std::ifstream::ifstream
                    (&arguments,
                     (char *)scripts.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,_S_in);
          line._M_dataplus._M_p = (pointer)&line.field_2;
          line._M_string_length = 0;
          line.field_2._M_allocated_capacity =
               line.field_2._M_allocated_capacity & 0xffffffffffffff00;
          while (piVar14 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                     ((istream *)&arguments,(string *)&line),
                sVar4 = line._M_string_length, _Var25 = line._M_dataplus,
                ((byte)piVar14[*(long *)(*(long *)piVar14 + -0x18) + 0x20] & 5) == 0) {
            vars._M_dataplus._M_p = (pointer)&vars.field_2;
            vars._M_string_length = 0;
            vars.field_2._M_local_buf[0] = '\0';
            invalidArgs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)&invalidArgs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
            invalidArgs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            invalidArgs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)((ulong)invalidArgs.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage &
                          0xffffffffffffff00);
            for (sVar18 = 0; sVar4 != sVar18; sVar18 = sVar18 + 1) {
              cVar1 = _Var25._M_p[sVar18];
              iVar8 = isalpha((int)cVar1);
              if (cVar1 == '_' || iVar8 != 0) {
                std::__cxx11::string::push_back((char)&vars);
              }
              else {
                iVar8 = isspace((int)cVar1);
                if (iVar8 == 0) break;
              }
            }
            if ((vars._M_string_length == 0) ||
               (invalidArgs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0)) {
              parser.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._8_8_ =
                   parser.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._8_8_ &
                   0xffffffffffffff00;
            }
            else {
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&result,&vars,(string *)&invalidArgs);
              std::
              optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::
              optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                        ((optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&parser,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&result);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&result);
            }
            std::__cxx11::string::~string((string *)&invalidArgs);
            std::__cxx11::string::~string((string *)&vars);
            if (parser.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._M_pod_data
                [8] == '\x01') {
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>&>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)(anonymous_namespace)::
                            GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                            ::s_os_release_abi_cxx11_,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&parser);
            }
            std::
            _Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_reset((_Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&parser);
          }
          std::__cxx11::string::~string((string *)&line);
          std::ifstream::~ifstream(&arguments);
          std::__cxx11::string::~string((string *)&scripts);
        }
        if ((anonymous_namespace)::
            GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)::
            s_os_release_abi_cxx11_._40_8_ != 0) goto LAB_00261c37;
        cmsys::Glob::Glob((Glob *)&arguments);
        scripts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        scripts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        scripts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        psVar13 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
        parser.super_Base.Bindings.Keywords.
        super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
        .
        super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)(psVar13->_M_dataplus)._M_p;
        parser.super_Base.Bindings.Keywords.
        super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
        .
        super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)psVar13->_M_string_length;
        result.
        super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_payload._M_value.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x23;
        result.
        super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_payload._M_value.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_825439;
        cmStrCat<>(&vars,(cmAlphaNum *)&parser,(cmAlphaNum *)&result);
        bVar6 = cmsys::Glob::FindFiles((Glob *)&arguments,&vars,(GlobMessages *)0x0);
        if (bVar6) {
          __x = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)&arguments);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(&scripts,__x);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&parser,"CMAKE_GET_OS_RELEASE_FALLBACK_SCRIPTS",
                   (allocator<char> *)&result);
        __it._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parser;
        cmMakefile::GetDefExpandList(pcVar3,__it._M_current,&scripts,false);
        std::__cxx11::string::~string((string *)&parser);
        pbVar23 = scripts.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        local_478._M_current =
             scripts.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        lVar24 = (long)scripts.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)scripts.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        pbVar22 = scripts.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        for (lVar17 = lVar24 >> 7; pbVar19 = pbVar22, 0 < lVar17; lVar17 = lVar17 + -1) {
          bVar6 = __gnu_cxx::__ops::
                  _Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::$_0>
                  ::operator()((_Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::__0>
                                *)pbVar22,__it);
          if (bVar6) goto LAB_002618bc;
          bVar6 = __gnu_cxx::__ops::
                  _Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::$_0>
                  ::operator()((_Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::__0>
                                *)(pbVar22 + 1),__it);
          pbVar19 = pbVar22 + 1;
          if (bVar6) goto LAB_002618bc;
          bVar6 = __gnu_cxx::__ops::
                  _Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::$_0>
                  ::operator()((_Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::__0>
                                *)(pbVar22 + 2),__it);
          pbVar19 = pbVar22 + 2;
          if (bVar6) goto LAB_002618bc;
          bVar6 = __gnu_cxx::__ops::
                  _Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::$_0>
                  ::operator()((_Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::__0>
                                *)(pbVar22 + 3),__it);
          pbVar19 = pbVar22 + 3;
          if (bVar6) goto LAB_002618bc;
          pbVar22 = pbVar22 + 4;
          lVar24 = lVar24 + -0x80;
        }
        lVar24 = lVar24 >> 5;
        if (lVar24 == 1) {
LAB_002618a9:
          bVar6 = __gnu_cxx::__ops::
                  _Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::$_0>
                  ::operator()((_Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::__0>
                                *)pbVar22,__it);
          pbVar19 = pbVar22;
          if (!bVar6) {
            pbVar19 = pbVar23;
          }
          goto LAB_002618bc;
        }
        if (lVar24 == 2) {
LAB_00261899:
          bVar6 = __gnu_cxx::__ops::
                  _Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::$_0>
                  ::operator()((_Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::__0>
                                *)pbVar22,__it);
          pbVar19 = pbVar22;
          if (bVar6) goto LAB_002618bc;
          pbVar22 = pbVar22 + 1;
          goto LAB_002618a9;
        }
        if (lVar24 == 3) {
          bVar6 = __gnu_cxx::__ops::
                  _Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::$_0>
                  ::operator()((_Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::__0>
                                *)pbVar22,__it);
          if (bVar6) goto LAB_002618bc;
          pbVar22 = pbVar22 + 1;
          goto LAB_00261899;
        }
        goto LAB_002618fa;
      }
      std::
      _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ::_Optional_base(&value.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ,(_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                         *)&registry);
LAB_00260c75:
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&registry);
      bVar6 = value.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_engaged;
      if (value.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged == false) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &arguments,"does not recognize <key> ",__rhs);
        std::__cxx11::string::_M_assign(local_268);
        std::__cxx11::string::~string((string *)&arguments);
      }
      else {
        std::__cxx11::string::append((string *)&result_list);
      }
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&value);
      uVar16 = local_278 + 1;
    } while (bVar6 != false);
    std::__cxx11::string::~string((string *)&result_list);
    return bVar5;
  }
  pbVar23 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_298._8_8_ =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_298._0_8_ = pbVar23 + 4;
  if (local_298._0_8_ == local_298._8_8_) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&arguments,"missing <key> specification.",(allocator<char> *)&parser);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    goto LAB_00260451;
  }
  parser.super_Base.Bindings.Positions.
  super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  .
  super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  parser.super_Base.Bindings.Positions.
  super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  .
  super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parser.super_Base.Bindings.ParsedKeyword._M_invoker = (_Invoker_type)0x0;
  parser.super_Base.Bindings.Positions.
  super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  .
  super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parser.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._8_8_ = 0;
  parser.super_Base.Bindings.ParsedKeyword.super__Function_base._M_manager = (_Manager_type)0x0;
  parser.super_Base.Bindings.KeywordMissingValue._M_invoker = (_Invoker_type)0x0;
  parser.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._M_unused._M_object =
       (void *)0x0;
  parser.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._8_8_ = 0;
  parser.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_manager =
       (_Manager_type)0x0;
  parser.super_Base.Bindings.Keywords.
  super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  .
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parser.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._M_unused._M_object
       = (void *)0x0;
  parser.super_Base.Bindings.Keywords.
  super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  .
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parser.super_Base.Bindings.Keywords.
  super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  .
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  name.super_string_view._M_str = "VALUE";
  name.super_string_view._M_len = 5;
  cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
  ::Bind<std::__cxx11::string>
            ((cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
              *)&parser,name,0x30);
  name_00.super_string_view._M_str = "VALUE_NAMES";
  name_00.super_string_view._M_len = 0xb;
  cmArgumentParser<Arguments>::Bind<bool>(&parser,name_00,0x50);
  name_01.super_string_view._M_str = "SUBKEYS";
  name_01.super_string_view._M_len = 7;
  cmArgumentParser<Arguments>::Bind<bool>(&parser,name_01,0x51);
  name_02.super_string_view._M_str = "VIEW";
  name_02.super_string_view._M_len = 4;
  cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
  ::Bind<std::__cxx11::string>
            ((cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
              *)&parser,name_02,0x58);
  name_03.super_string_view._M_str = "SEPARATOR";
  name_03.super_string_view._M_len = 9;
  cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
  ::Bind<std::__cxx11::string>
            ((cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
              *)&parser,name_03,0x78);
  name_04.super_string_view._M_str = "ERROR_VARIABLE";
  name_04.super_string_view._M_len = 0xe;
  cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
  ::Bind<std::__cxx11::string>
            ((cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
              *)&parser,name_04,0x98);
  result.
  super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_payload._M_value.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&invalidArgs;
  invalidArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298._0_8_ = local_298._0_8_ + 0x20;
  arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header;
  arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       (ulong)(uint)arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header.
                    _M_header._4_4_ << 0x20;
  arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  arguments.ValueName._M_dataplus._M_p = (pointer)&arguments.ValueName.field_2;
  arguments.ValueName._M_string_length = 0;
  arguments.ValueName.field_2._M_local_buf[0] = '\0';
  arguments.ValueNames = false;
  arguments.SubKeys = false;
  arguments.View._M_dataplus._M_p = (pointer)&arguments.View.field_2;
  arguments.View._M_string_length = 0;
  arguments.View.field_2._M_local_buf[0] = '\0';
  arguments.Separator._M_dataplus._M_p = (pointer)&arguments.Separator.field_2;
  arguments.Separator._M_string_length = 0;
  invalidArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  invalidArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  arguments.Separator.field_2._M_local_buf[0] = '\0';
  arguments.ErrorVariable._M_dataplus._M_p = (pointer)&arguments.ErrorVariable.field_2;
  arguments.ErrorVariable._M_string_length = 0;
  arguments.ErrorVariable.field_2._M_local_buf[0] = '\0';
  result.
  super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_payload._M_value.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&arguments;
  local_2c0._M_unused._M_object = (void *)0x0;
  local_2c0._8_8_ = 0;
  local_2b0 = (_Manager_type)0x0;
  p_Stack_2a8 = (_Invoker_type)0x0;
  local_2a0 = false;
  result.
  super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_payload._M_value.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&parser;
  result.
  super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._24_8_ = result.
            super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_payload._M_value.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
       _M_left;
  ArgumentParser::Instance::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Instance *)&result,
             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)local_298,0);
  std::_Function_base::~_Function_base((_Function_base *)&local_2c0);
  if (invalidArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      invalidArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar5 = ArgumentParser::ParseResult::MaybeReportError
                      (&arguments.super_ParseResult,status->Makefile);
    bVar6 = true;
    if (bVar5) goto LAB_00260778;
    if (arguments.ValueName._M_string_length == 0) {
      if ((arguments.ValueNames != false) && (arguments.SubKeys == true)) goto LAB_00261d2b;
    }
    else if ((arguments.ValueNames != false) || (arguments.SubKeys != false)) {
LAB_00261d2b:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&result,
                 "given mutually exclusive sub-options \"VALUE\", \"VALUE_NAMES\" or \"SUBKEYS\".",
                 (allocator<char> *)&registry);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      psVar21 = (string *)&result;
      goto LAB_00260770;
    }
    if ((arguments.View._M_string_length == 0) ||
       (name_05._M_str = extraout_RDX, name_05._M_len = (size_t)arguments.View._M_dataplus._M_p,
       oVar15 = cmWindowsRegistry::ToView
                          ((cmWindowsRegistry *)arguments.View._M_string_length,name_05),
       ((ulong)oVar15.super__Optional_base<cmWindowsRegistry::View,_true,_true>._M_payload.
               super__Optional_payload_base<cmWindowsRegistry::View> >> 0x20 & 1) != 0)) {
      pcVar3 = status->Makefile;
      view._M_value = Both;
      cmMakefile::AddDefinition(pcVar3,psVar21,(string_view)(ZEXT816(0x61ebb9) << 0x40));
      if (arguments.View._M_string_length != 0) {
        name_06._M_str = extraout_RDX_00;
        name_06._M_len = (size_t)arguments.View._M_dataplus._M_p;
        oVar15 = cmWindowsRegistry::ToView
                           ((cmWindowsRegistry *)arguments.View._M_string_length,name_06);
        view._M_value =
             oVar15.super__Optional_base<cmWindowsRegistry::View,_true,_true>._M_payload.
             super__Optional_payload_base<cmWindowsRegistry::View>._M_payload;
      }
      cmWindowsRegistry::cmWindowsRegistry(&registry,pcVar3,&cmWindowsRegistry::AllTypes);
      if (arguments.ValueNames == true) {
        key._M_str = pbVar23[4]._M_dataplus._M_p;
        key._M_len = pbVar23[4]._M_string_length;
        cmWindowsRegistry::GetValueNames_abi_cxx11_(&result,&registry,key,view._M_value);
        if (result.
            super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_engaged == true) {
          separator_01._M_str = ";";
          separator_01._M_len = 1;
          cmJoin((string *)&value,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&result,separator_01,(string_view)ZEXT816(0));
          value_08._M_str =
               (char *)value.
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._M_payload._M_value._M_dataplus._M_p;
          value_08._M_len =
               value.
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_payload._M_value._M_string_length;
          cmMakefile::AddDefinition(pcVar3,psVar21,value_08);
LAB_00261f55:
          std::__cxx11::string::~string((string *)&value);
        }
LAB_00261f62:
        std::
        _Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_M_reset((_Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&result);
      }
      else {
        if (arguments.SubKeys == true) {
          key_00._M_str = pbVar23[4]._M_dataplus._M_p;
          key_00._M_len = pbVar23[4]._M_string_length;
          cmWindowsRegistry::GetSubKeys_abi_cxx11_(&result,&registry,key_00,view._M_value);
          if (result.
              super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_engaged == true) {
            separator_02._M_str = ";";
            separator_02._M_len = 1;
            cmJoin((string *)&value,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&result,separator_02,(string_view)ZEXT816(0));
            value_09._M_str =
                 (char *)value.
                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ._M_payload._M_value._M_dataplus._M_p;
            value_09._M_len =
                 value.
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._M_value._M_string_length;
            cmMakefile::AddDefinition(pcVar3,psVar21,value_09);
            goto LAB_00261f55;
          }
          goto LAB_00261f62;
        }
        scripts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)arguments.Separator._M_string_length;
        scripts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)arguments.Separator._M_dataplus._M_p;
        separator._M_str = arguments.Separator._M_dataplus._M_p;
        separator._M_len = arguments.Separator._M_string_length;
        name_07._M_str = arguments.ValueName._M_dataplus._M_p;
        name_07._M_len = arguments.ValueName._M_string_length;
        key_01._M_str = pbVar23[4]._M_dataplus._M_p;
        key_01._M_len = pbVar23[4]._M_string_length;
        cmWindowsRegistry::ReadValue_abi_cxx11_
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&result,&registry,key_01,name_07,view._M_value,separator);
        std::
        _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&result);
      }
      if (arguments.ErrorVariable._M_string_length != 0) {
        sVar26 = cmWindowsRegistry::GetLastError(&registry);
        cmMakefile::AddDefinition(pcVar3,&arguments.ErrorVariable,sVar26);
      }
      std::__cxx11::string::~string((string *)&registry);
      goto LAB_00260778;
    }
    result.
    super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_payload._M_value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x20;
    result.
    super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_payload._M_value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_824e9f;
    registry.LastError._M_dataplus._M_p = (pointer)arguments.View._M_string_length;
    registry.LastError._M_string_length = (size_type)arguments.View._M_dataplus._M_p;
    vars._M_dataplus._M_p._0_1_ = 0x2e;
    cmStrCat<char>((string *)&value,(cmAlphaNum *)&result,(cmAlphaNum *)&registry,(char *)&vars);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    psVar21 = (string *)&value;
  }
  else {
    result.
    super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_payload._M_value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_0000001b;
    result.
    super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_payload._M_value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_824e57;
    separator_00._M_str = ", ";
    separator_00._M_len = 2;
    cmJoin(&vars,&invalidArgs,separator_00,(string_view)ZEXT816(0));
    registry.LastError._M_dataplus._M_p = (pointer)vars._M_string_length;
    registry.LastError._M_string_length = (size_type)vars._M_dataplus._M_p;
    cmStrCat<char[3]>((string *)&value,(cmAlphaNum *)&result,(cmAlphaNum *)&registry,
                      (char (*) [3])0x5b59a8);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&value);
    psVar21 = &vars;
  }
LAB_00260770:
  std::__cxx11::string::~string((string *)psVar21);
  bVar6 = false;
LAB_00260778:
  anon_unknown.dwarf_8134e1::anon_func::Arguments::~Arguments(&arguments);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&invalidArgs);
  ArgumentParser::ActionMap::~ActionMap((ActionMap *)&parser);
  return bVar6;
code_r0x002612e8:
  std::__cxx11::string::~string((string *)&scripts);
  lVar17 = lVar17 + 0x10;
  goto LAB_00261293;
LAB_002618bc:
  this_00 = pbVar19;
  local_478._M_current = pbVar19;
  if (pbVar19 != pbVar23) {
    while (this_00 = this_00 + 1, local_478._M_current = pbVar19, this_00 != pbVar23) {
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::$_0>
              ::operator()((_Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::__0>
                            *)this_00,__it);
      if (!bVar6) {
        __it._M_current = this_00;
        std::__cxx11::string::operator=((string *)pbVar19,(string *)this_00);
        pbVar19 = pbVar19 + 1;
      }
    }
  }
LAB_002618fa:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase(&scripts,local_478,
          (const_iterator)
          scripts.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish);
  pbVar22 = scripts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pbVar23 = scripts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (scripts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      scripts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar24 = (long)scripts.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)scripts.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar16 = lVar24 >> 5;
    lVar17 = 0x3f;
    if (uVar16 != 0) {
      for (; uVar16 >> lVar17 == 0; lVar17 = lVar17 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::GetOSReleaseVariables(cmExecutionStatus&)::__1>>
              (scripts.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               scripts.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar17 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar24 < 0x201) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::GetOSReleaseVariables(cmExecutionStatus&)::__1>>
                (pbVar23,pbVar22);
    }
    else {
      pbVar20 = pbVar23 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::GetOSReleaseVariables(cmExecutionStatus&)::__1>>
                (pbVar23,pbVar20);
      for (; pbVar20 != pbVar22; pbVar20 = pbVar20 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Val_comp_iter<(anonymous_namespace)::GetOSReleaseVariables(cmExecutionStatus&)::__1>>
                  (pbVar20);
      }
    }
  }
  local_270 = scripts.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar23 = scripts.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar23 != local_270;
      pbVar23 = pbVar23 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&parser,"CMAKE_GET_OS_RELEASE_FALLBACK_RESULT",(allocator<char> *)&result);
    cmMakefile::RemoveDefinition(pcVar3,(string *)&parser);
    std::__cxx11::string::~string((string *)&parser);
    bVar6 = cmMakefile::ReadListFile(pcVar3,pbVar23);
    if ((bVar6) && (bVar6 = cmSystemTools::GetErrorOccurredFlag(), !bVar6)) {
      line._M_dataplus._M_p = (pointer)0x0;
      line._M_string_length = 0;
      line.field_2._M_allocated_capacity = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&parser,"CMAKE_GET_OS_RELEASE_FALLBACK_RESULT",(allocator<char> *)&result
                );
      bVar6 = cmMakefile::GetDefExpandList
                        (pcVar3,(string *)&parser,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&line,false);
      std::__cxx11::string::~string((string *)&parser);
      sVar4 = line._M_string_length;
      _Var25 = line._M_dataplus;
      if (bVar6) {
        for (; _Var25._M_p != (pointer)sVar4; _Var25._M_p = (pointer)((long)_Var25._M_p + 0x20)) {
          psVar13 = cmMakefile::GetSafeDefinition(pcVar3,(string *)_Var25._M_p);
          std::__cxx11::string::string((string *)&invalidArgs,(string *)psVar13);
          cmMakefile::RemoveDefinition(pcVar3,(string *)_Var25._M_p);
          pcVar2 = (((string *)_Var25._M_p)->_M_dataplus)._M_p;
          sVar18 = ((string *)_Var25._M_p)->_M_string_length;
          parser.super_Base.Bindings.Keywords.
          super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
          .
          super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x24;
          parser.super_Base.Bindings.Keywords.
          super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
          .
          super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_825469;
          result.
          super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_payload._M_value.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
          result.
          super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_payload._M_value.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)((long)&result.
                                super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
                                ._M_payload.
                                super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ._M_payload + 0x10);
          result.
          super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_payload._16_1_ = 0x5f;
          cmStrCat<>((string *)local_298,(cmAlphaNum *)&parser,(cmAlphaNum *)&result);
          str_00._M_str = pcVar2;
          str_00._M_len = sVar18;
          prefix_00._M_str = (char *)local_298._0_8_;
          prefix_00._M_len = local_298._8_8_;
          bVar6 = cmHasPrefix(str_00,prefix_00);
          std::__cxx11::string::~string((string *)local_298);
          if (bVar6) {
            std::__cxx11::string::substr((ulong)&parser,(ulong)_Var25._M_p);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)(anonymous_namespace)::
                          GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                          ::s_os_release_abi_cxx11_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parser,
                       (string *)&invalidArgs);
            std::__cxx11::string::~string((string *)&parser);
          }
          std::__cxx11::string::~string((string *)&invalidArgs);
        }
        if ((anonymous_namespace)::
            GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)::
            s_os_release_abi_cxx11_._40_8_ != 0) {
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<char_const(&)[21],std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)(anonymous_namespace)::
                        GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                        ::s_os_release_abi_cxx11_,(char (*) [21])"USED_FALLBACK_SCRIPT",pbVar23);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&line);
          break;
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&line);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&parser,"CMAKE_GET_OS_RELEASE_FALLBACK_RESULT",(allocator<char> *)&result);
  cmMakefile::RemoveDefinition(pcVar3,(string *)&parser);
  std::__cxx11::string::~string((string *)&parser);
  std::__cxx11::string::~string((string *)&vars);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&scripts);
  cmsys::Glob::~Glob((Glob *)&arguments);
LAB_00261c37:
  __cxa_atexit(std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::~map,(anonymous_namespace)::
                      GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                      ::s_os_release_abi_cxx11_,&__dso_handle);
  __cxa_guard_release(&(anonymous_namespace)::
                       GetValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                       ::s_os_release_abi_cxx11_);
  goto LAB_002609af;
}

Assistant:

bool cmCMakeHostSystemInformationCommand(std::vector<std::string> const& args,
                                         cmExecutionStatus& status)
{
  std::size_t current_index = 0;

  if (args.size() < (current_index + 2) || args[current_index] != "RESULT"_s) {
    status.SetError("missing RESULT specification.");
    return false;
  }

  auto const& variable = args[current_index + 1];
  current_index += 2;

  if (args.size() < (current_index + 2) || args[current_index] != "QUERY"_s) {
    status.SetError("missing QUERY specification");
    return false;
  }

  if (args[current_index + 1] == "WINDOWS_REGISTRY"_s) {
    return QueryWindowsRegistry(cmMakeRange(args).advance(current_index + 2),
                                status, variable);
  }

  static cmsys::SystemInformation info;
  static auto initialized = false;
  if (!initialized) {
    info.RunCPUCheck();
    info.RunOSCheck();
    info.RunMemoryCheck();
    initialized = true;
  }

  std::string result_list;
  for (auto i = current_index + 1; i < args.size(); ++i) {
    result_list += DELIM[!result_list.empty()];

    auto const& key = args[i];
    // clang-format off
    auto value =
      GetValueChained(
          [&]() { return GetValue(info, key); }
        , [&]() { return GetValue(status, key, variable); }
#ifdef HAVE_VS_SETUP_HELPER
        , [&]() { return GetValue(status, key); }
#endif
        );
    // clang-format on
    if (!value) {
      status.SetError("does not recognize <key> " + key);
      return false;
    }
    result_list += value.value();
  }

  status.GetMakefile().AddDefinition(variable, result_list);

  return true;
}